

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_alignment.cc
# Opt level: O0

VertexAlignment *
s2polyline_alignment::AlignmentFn
          (VertexAlignment *__return_storage_ptr__,S2Polyline *a,S2Polyline *b,bool approx)

{
  bool approx_local;
  S2Polyline *b_local;
  S2Polyline *a_local;
  
  if (approx) {
    GetApproxVertexAlignment(__return_storage_ptr__,a,b);
  }
  else {
    GetExactVertexAlignment(__return_storage_ptr__,a,b);
  }
  return __return_storage_ptr__;
}

Assistant:

VertexAlignment AlignmentFn(const S2Polyline& a, const S2Polyline& b,
                            bool approx) {
  return approx ? GetApproxVertexAlignment(a, b)
                : GetExactVertexAlignment(a, b);
}